

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O1

void __thiscall Deck::draw(Deck *this,Hand *userHand)

{
  CardType CVar1;
  vector<CardType,_std::allocator<CardType>_> *pvVar2;
  pointer pCVar3;
  vector<CardType,std::allocator<CardType>> *this_00;
  iterator __position;
  int *piVar4;
  pointer pCVar5;
  CardType drawnCard;
  CardType local_24;
  
  pvVar2 = this->deckPointer;
  pCVar5 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  CVar1 = pCVar5[-1];
  pCVar5 = pCVar5 + -1;
  (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data.
  _M_finish = pCVar5;
  pCVar3 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (int *)operator_new(4);
  *piVar4 = (int)((ulong)((long)pCVar5 - (long)pCVar3) >> 2);
  this->deckSize = piVar4;
  this_00 = (vector<CardType,std::allocator<CardType>> *)userHand->handPointer;
  __position._M_current = *(CardType **)(this_00 + 8);
  if (__position._M_current == *(CardType **)(this_00 + 0x10)) {
    std::vector<CardType,std::allocator<CardType>>::_M_realloc_insert<CardType_const&>
              (this_00,__position,&local_24);
  }
  else {
    *__position._M_current = CVar1;
    *(CardType **)(this_00 + 8) = __position._M_current + 1;
  }
  return;
}

Assistant:

void Deck::draw(Hand& userHand) {
    CardType drawnCard = deckPointer->back();
    deckPointer->pop_back();
    Deck::setNumberOfCards(deckPointer->size());
    userHand.getHand()->push_back(drawnCard);
}